

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O3

int x509_info_cert_policies(char **buf,size_t *size,mbedtls_x509_sequence *certificate_policies)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  size_t __maxlen;
  char *__s;
  bool bVar5;
  char *local_38;
  char *desc;
  
  __maxlen = *size;
  __s = *buf;
  if (certificate_policies != (mbedtls_x509_sequence *)0x0) {
    pcVar4 = anon_var_dwarf_66ec33 + 9;
    do {
      iVar1 = mbedtls_oid_get_certificate_policies(&certificate_policies->buf,&local_38);
      if (iVar1 != 0) {
        local_38 = "???";
      }
      uVar2 = snprintf(__s,__maxlen,"%s%s",pcVar4,local_38);
      if ((int)uVar2 < 0) {
        return -0x2980;
      }
      uVar3 = (ulong)uVar2;
      bVar5 = __maxlen < uVar3;
      __maxlen = __maxlen - uVar3;
      if (bVar5 || __maxlen == 0) {
        return -0x2980;
      }
      __s = __s + uVar3;
      certificate_policies = certificate_policies->next;
      pcVar4 = ", ";
    } while (certificate_policies != (mbedtls_asn1_sequence *)0x0);
  }
  *size = __maxlen;
  *buf = __s;
  return 0;
}

Assistant:

static int x509_info_cert_policies(char **buf, size_t *size,
                                   const mbedtls_x509_sequence *certificate_policies)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const char *desc;
    size_t n = *size;
    char *p = *buf;
    const mbedtls_x509_sequence *cur = certificate_policies;
    const char *sep = "";

    while (cur != NULL) {
        if (mbedtls_oid_get_certificate_policies(&cur->buf, &desc) != 0) {
            desc = "???";
        }

        ret = mbedtls_snprintf(p, n, "%s%s", sep, desc);
        MBEDTLS_X509_SAFE_SNPRINTF;

        sep = ", ";

        cur = cur->next;
    }

    *size = n;
    *buf = p;

    return 0;
}